

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option.hpp
# Opt level: O1

OptionBase<Inferences::ALASCA::FourierMotzkinConf::Rhs> * __thiscall
Lib::OptionBase<Inferences::ALASCA::FourierMotzkinConf::Rhs>::operator=
          (OptionBase<Inferences::ALASCA::FourierMotzkinConf::Rhs> *this,
          OptionBase<Inferences::ALASCA::FourierMotzkinConf::Rhs> *other)

{
  Rhs local_50;
  
  if (other->_isSome == true) {
    Inferences::ALASCA::FourierMotzkinConf::Rhs::Rhs(&local_50,(Rhs *)&other->_elem);
    Inferences::ALASCA::FourierMotzkinConf::Rhs::Rhs((Rhs *)&this->_elem,&local_50);
  }
  this->_isSome = other->_isSome;
  return this;
}

Assistant:

OptionBase& operator=(OptionBase&& other)
  {
    if (_isSome) {
      unwrap().~A();
    }
    if (other._isSome) {
      _elem.init(move_if_value<A>(other.unwrap()));
    }
    _isSome = other._isSome;
    return *this;
  }